

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O3

wchar_t cmp_for_sort_items(void *left,void *right)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  code *pcVar4;
  long *plVar5;
  long lVar6;
  
  pcVar4 = (code *)*sort_dat_1;
  if (pcVar4 != (code *)0x0) {
    iVar1 = *right;
    iVar2 = *left;
    lVar6 = 0x10;
    plVar5 = sort_dat_1;
    do {
      wVar3 = (*pcVar4)(sort_dat_0 + (long)iVar2 * 0x38,sort_dat_0 + (long)iVar1 * 0x38,
                        (int)plVar5[1]);
      if (wVar3 != L'\0') {
        return wVar3;
      }
      pcVar4 = *(code **)((long)sort_dat_1 + lVar6);
      plVar5 = (long *)((long)sort_dat_1 + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (pcVar4 != (code *)0x0);
  }
  return L'\0';
}

Assistant:

static int cmp_for_sort_items(const void *left, const void *right)
{
	int ileft = *((int*) left);
	int iright = *((int*) right);
	int i = 0;

	while (1) {
		int cres;

		if (sort_dat.arr[i].func == 0) {
			return 0;
		}
		cres = (*sort_dat.arr[i].func)(sort_dat.items + ileft,
			sort_dat.items + iright, sort_dat.arr[i].propind);
		if (cres != 0) {
			return cres;
		}
		++i;
	}
}